

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O3

void HandleInstruction(char *opcode,uint arg_count,char **arg_array)

{
  int iVar1;
  void *__ptr;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)arg_count;
  __ptr = malloc(uVar3 * 8);
  if (__ptr == (void *)0x0) {
    PrintError("Error: malloc failed. Great.");
    return;
  }
  if (arg_count != 0) {
    uVar4 = 0;
    do {
      lVar2 = LookupDictionary(arg_array[uVar4]);
      *(long *)((long)__ptr + uVar4 * 8) = lVar2;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  lVar2 = 8;
  do {
    iVar1 = strcmp(opcode,*(char **)((long)dac_samples_s3 + lVar2 + 8));
    if (iVar1 == 0) {
      (**(code **)((long)&symbol_function_table[0].symbol + lVar2))(arg_count,__ptr);
      goto LAB_00103b13;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x4d8);
  iVar1 = strcmp(opcode,"dc.b");
  if (iVar1 == 0) {
    if (arg_count != 0) {
      uVar4 = 0;
      do {
        lVar2 = *(long *)((long)__ptr + uVar4 * 8);
        if (0xff < lVar2) {
          PrintError("Error: dc.b value must fit into a byte\n");
        }
        MemoryStream_WriteByte(output_stream,(uchar)lVar2);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  else {
    PrintError("Error: Unhandled instruction: \'%s\'\n",opcode);
  }
LAB_00103b13:
  free(__ptr);
  return;
}

Assistant:

void HandleInstruction(char *opcode, unsigned int arg_count, char *arg_array[])
{
	long *int_arg_array = malloc(sizeof(long) * arg_count);
	if (int_arg_array == NULL)
	{
		PrintError("Error: malloc failed. Great.");
		return;
	}

	// Convert arguments from symbols to numbers (*everything* resolves to a number eventually - code, labels, constants, etc.)
	for (unsigned int i = 0; i < arg_count; ++i)
		int_arg_array[i] = LookupDictionary(arg_array[i]);

	// Execute the function that matches the instruction
	for (unsigned int i = 0; i < sizeof(symbol_function_table) / sizeof(symbol_function_table[0]); ++i)
	{
		if (strcmp(opcode, symbol_function_table[i].symbol) == 0)
		{
			symbol_function_table[i].function(arg_count, int_arg_array);
			free(int_arg_array);
			return;
		}
	}

	// If the instruction doesn't match any of the SMPS2ASM macros, check if it's the 68k's 'dc.b' instruction
	if (strcmp(opcode, "dc.b") == 0)
	{
		for (unsigned int i = 0; i < arg_count; ++i)
		{
			const long value = int_arg_array[i];

			if (value > 0xFF)
				PrintError("Error: dc.b value must fit into a byte\n");

			WriteByte(value);
		}
	}
	else
	{
		// Oh no
		PrintError("Error: Unhandled instruction: '%s'\n", opcode);
	}

	free(int_arg_array);
}